

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

void __thiscall mocker::Lexer::stringLiteral(Lexer *this,string *curTok)

{
  bool bVar1;
  char *pcVar2;
  reference pcVar3;
  LexError *pLVar4;
  string local_58;
  TokenID local_34;
  char *local_30;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  iter;
  anon_class_8_1_8991fb9c convert;
  string *curTok_local;
  Lexer *this_local;
  
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)curTok);
  if (*pcVar2 != '\"') {
    __assert_fail("curTok[0] == \'\"\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/parse/lexer.cpp"
                  ,0xd0,"void mocker::Lexer::stringLiteral(const std::string &)");
  }
  iter._M_current = (char *)this;
  local_28 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator+(&this->curBeg,1);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&local_28,&this->srcEnd);
    if (!bVar1) {
      pLVar4 = (LexError *)__cxa_allocate_exception(0x48);
      LexError::LexError(pLVar4,this->curPos,this->nxtPos);
      __cxa_throw(pLVar4,&LexError::typeinfo,LexError::~LexError);
    }
    pcVar3 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_28);
    if (*pcVar3 == '\"') {
      local_30 = (char *)__gnu_cxx::
                         __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::operator+(&local_28,1);
      (this->nxtBeg)._M_current = local_30;
      local_34 = StringLit;
      stringLiteral(std::__cxx11::string_const&)::$_0::operator()::string_>__const
                (&local_58,&iter,(StrIter)(this->curBeg)._M_current,(StrIter)local_28._M_current);
      std::vector<mocker::Token,std::allocator<mocker::Token>>::
      emplace_back<mocker::TokenID,mocker::Position&,mocker::Position&,std::__cxx11::string>
                ((vector<mocker::Token,std::allocator<mocker::Token>> *)&this->tokens,&local_34,
                 &this->curPos,&this->nxtPos,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      return;
    }
    pcVar3 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_28);
    if (*pcVar3 == '\\') {
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_28);
      bVar1 = __gnu_cxx::operator==(&local_28,&this->srcEnd);
      if (bVar1) {
        pLVar4 = (LexError *)__cxa_allocate_exception(0x48);
        LexError::LexError(pLVar4,this->curPos,this->nxtPos);
        __cxa_throw(pLVar4,&LexError::typeinfo,LexError::~LexError);
      }
    }
    pcVar3 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_28);
    if (*pcVar3 == '\n') break;
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_28);
  }
  pLVar4 = (LexError *)__cxa_allocate_exception(0x48);
  LexError::LexError(pLVar4,this->curPos,this->nxtPos);
  __cxa_throw(pLVar4,&LexError::typeinfo,LexError::~LexError);
}

Assistant:

void Lexer::stringLiteral(const std::string &curTok) {
  assert(curTok[0] == '"');
  auto convert = [this](StrIter beg, StrIter end) -> std::string {
    std::string res;
    for (auto iter = beg + 1; iter < end; ++iter) {
      if (*iter == '\\') {
        if (iter + 1 == end)
          throw LexError(curPos, nxtPos);
        char nxt = *(iter + 1);
        switch (nxt) {
        case 'a':
          res.push_back('\a');
          break;
        case 'b':
          res.push_back('\b');
          break;
        case 'f':
          res.push_back('\f');
          break;
        case 'n':
          res.push_back('\n');
          break;
        case 'r':
          res.push_back('\r');
          break;
        case 't':
          res.push_back('\t');
          break;
        case 'v':
          res.push_back('\v');
          break;
        case '\\':
          res.push_back('\\');
          break;
        case '\"':
          res.push_back('"');
          break;
        default:
          throw LexError(curPos, nxtPos);
        }
        ++iter;
      } else {
        res.push_back(*iter);
      }
    }
    return res;
  };

  for (auto iter = curBeg + 1; iter != srcEnd; ++iter) {
    if (*iter == '"') {
      nxtBeg = iter + 1;
      tokens.emplace_back(TokenID::StringLit, curPos, nxtPos,
                          convert(curBeg, iter));
      return;
    }
    if (*iter == '\\') {
      ++iter;
      if (iter == srcEnd)
        throw LexError(curPos, nxtPos);
    }
    if (*iter == '\n')
      throw LexError(curPos, nxtPos);
  }
  throw LexError(curPos, nxtPos);
}